

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

void append_entry(char **p,char *prefix,wchar_t type,wchar_t tag,wchar_t flags,char *name,
                 wchar_t perm,wchar_t id)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  wchar_t local_3c;
  
  local_3c = id;
  if (prefix != (char *)0x0) {
    strcpy(*p,prefix);
    pcVar2 = *p;
    sVar1 = strlen(pcVar2);
    *p = pcVar2 + sVar1;
  }
  switch(tag) {
  case L'✑':
    goto switchD_005fbc50_caseD_2711;
  case L'✒':
    if ((type & 0x3c00U) != 0) {
      builtin_strncpy(*p,"owner@",7);
      break;
    }
    local_3c = L'\xffffffff';
    name = (char *)0x0;
    goto switchD_005fbc50_caseD_2711;
  case L'✓':
switchD_005fbc50_caseD_2713:
    builtin_strncpy(*p,"group",6);
    goto LAB_005fbd12;
  case L'✔':
    if ((type & 0x3c00U) == 0) {
      local_3c = L'\xffffffff';
      name = (char *)0x0;
      goto switchD_005fbc50_caseD_2713;
    }
    builtin_strncpy(*p,"group@",7);
    break;
  case L'✕':
    builtin_strncpy(*p,"mask",5);
    break;
  case L'✖':
    builtin_strncpy(*p,"other",6);
    break;
  default:
    if (tag != L'❻') goto LAB_005fbd12;
    builtin_strncpy(*p,"everyone@",10);
  }
  local_3c = L'\xffffffff';
  name = (char *)0x0;
LAB_005fbd12:
  pcVar2 = *p;
  sVar1 = strlen(pcVar2);
  pcVar2 = pcVar2 + sVar1;
  *p = pcVar2 + 1;
  *pcVar2 = ':';
  if (((type & 0x300U) != 0) || ((tag | 2U) == 0x2713)) {
    if (name == (char *)0x0) {
      if ((tag | 2U) == 0x2713) {
        append_id(p,local_3c);
        local_3c = local_3c | -(uint)((type & 0x3c00U) == 0);
      }
    }
    else {
      strcpy(*p,name);
      pcVar2 = *p;
      sVar1 = strlen(pcVar2);
      *p = pcVar2 + sVar1;
    }
    if ((0xfffffffdU < (uint)(tag + L'\xffffd8e9') & (byte)((uint)(flags & 4U) >> 2)) == 0) {
      pcVar2 = *p;
      *p = pcVar2 + 1;
      *pcVar2 = ':';
    }
  }
  if ((type & 0x300U) == 0) {
    lVar3 = 4;
    do {
      if ((*(uint *)(&UNK_00760ecc + lVar3) & perm) == 0) {
        cVar4 = '-';
        if ((flags & 0x10U) == 0) goto LAB_005fbe53;
      }
      else {
        cVar4 = *(char *)((long)&nfsv4_acl_perm_map[0].perm + lVar3);
LAB_005fbe53:
        pcVar2 = *p;
        *p = pcVar2 + 1;
        *pcVar2 = cVar4;
      }
      lVar3 = lVar3 + 0xc;
    } while (lVar3 != 0xac);
    pcVar2 = *p;
    *p = pcVar2 + 1;
    *pcVar2 = ':';
    lVar3 = 4;
    do {
      if ((*(uint *)(&UNK_00760f7c + lVar3) & perm) == 0) {
        cVar4 = '-';
        if ((flags & 0x10U) == 0) goto LAB_005fbe98;
      }
      else {
        cVar4 = *(char *)((long)&nfsv4_acl_flag_map[0].perm + lVar3);
LAB_005fbe98:
        pcVar2 = *p;
        *p = pcVar2 + 1;
        *pcVar2 = cVar4;
      }
      lVar3 = lVar3 + 0xc;
    } while (lVar3 != 0x58);
    pcVar2 = *p;
    *p = pcVar2 + 1;
    *pcVar2 = ':';
    switch(type << 0x16 | (uint)(type + L'\xfffffc00') >> 10) {
    case L'\0':
      builtin_strncpy(*p,"allow",6);
      break;
    case L'\x01':
      builtin_strncpy(*p,"deny",5);
      break;
    case L'\x03':
      builtin_strncpy(*p,"audit",6);
      break;
    case L'\a':
      builtin_strncpy(*p,"alarm",6);
    }
    pcVar2 = *p;
    sVar1 = strlen(pcVar2);
    *p = pcVar2 + sVar1;
  }
  else {
    cVar4 = 'r';
    if ((perm & 0x124U) == 0) {
      cVar4 = '-';
    }
    pcVar2 = *p;
    *p = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = 'w';
    if ((perm & 0x92U) == 0) {
      cVar4 = '-';
    }
    pcVar2 = *p;
    *p = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = 'x';
    if ((perm & 0x49U) == 0) {
      cVar4 = '-';
    }
    pcVar2 = *p;
    *p = pcVar2 + 1;
    *pcVar2 = cVar4;
  }
  if (local_3c != L'\xffffffff') {
    pcVar2 = *p;
    *p = pcVar2 + 1;
    *pcVar2 = ':';
    append_id(p,local_3c);
    return;
  }
  return;
switchD_005fbc50_caseD_2711:
  builtin_strncpy(*p,"user",5);
  goto LAB_005fbd12;
}

Assistant:

static void
append_entry(char **p, const char *prefix, int type,
    int tag, int flags, const char *name, int perm, int id)
{
	int i;

	if (prefix != NULL) {
		strcpy(*p, prefix);
		*p += strlen(*p);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		name = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			strcpy(*p, "owner@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		strcpy(*p, "user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		name = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			strcpy(*p, "group@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		strcpy(*p, "group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		strcpy(*p, "mask");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		strcpy(*p, "other");
		name = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		strcpy(*p, "everyone@");
		name = NULL;
		id = -1;
		break;
	}
	*p += strlen(*p);
	*(*p)++ = ':';
	if (((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) ||
	    tag == ARCHIVE_ENTRY_ACL_USER ||
	    tag == ARCHIVE_ENTRY_ACL_GROUP) {
		if (name != NULL) {
			strcpy(*p, name);
			*p += strlen(*p);
		} else if (tag == ARCHIVE_ENTRY_ACL_USER
		    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
			append_id(p, id);
			if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0)
				id = -1;
		}
		/* Solaris style has no second colon after other and mask */
		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) == 0)
		    || (tag != ARCHIVE_ENTRY_ACL_OTHER
		    && tag != ARCHIVE_ENTRY_ACL_MASK))
			*(*p)++ = ':';
	}
	if ((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) {
		/* POSIX.1e ACL perms */
		*(*p)++ = (perm & 0444) ? 'r' : '-';
		*(*p)++ = (perm & 0222) ? 'w' : '-';
		*(*p)++ = (perm & 0111) ? 'x' : '-';
	} else {
		/* NFSv4 ACL perms */
		for (i = 0; i < nfsv4_acl_perm_map_size; i++) {
			if (perm & nfsv4_acl_perm_map[i].perm)
				*(*p)++ = nfsv4_acl_perm_map[i].c;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*p)++ = '-';
		}
		*(*p)++ = ':';
		for (i = 0; i < nfsv4_acl_flag_map_size; i++) {
			if (perm & nfsv4_acl_flag_map[i].perm)
				*(*p)++ = nfsv4_acl_flag_map[i].c;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*p)++ = '-';
		}
		*(*p)++ = ':';
		switch (type) {
		case ARCHIVE_ENTRY_ACL_TYPE_ALLOW:
			strcpy(*p, "allow");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_DENY:
			strcpy(*p, "deny");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_AUDIT:
			strcpy(*p, "audit");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_ALARM:
			strcpy(*p, "alarm");
			break;
		}
		*p += strlen(*p);
	}
	if (id != -1) {
		*(*p)++ = ':';
		append_id(p, id);
	}
}